

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_bitnet::llm_build_bitnet
          (llm_build_bitnet *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  const_reference pvVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ggml_backend_buffer *name;
  ggml_tensor *pgVar8;
  ggml_tensor *cur_00;
  pointer plVar9;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_type local_308;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffd00;
  ggml_tensor *in_stack_fffffffffffffd08;
  ggml_tensor *mb;
  ggml_tensor *in_stack_fffffffffffffd10;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd18;
  undefined4 uVar11;
  ggml_tensor *pgVar10;
  llm_graph_context *in_stack_fffffffffffffd20;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *down_b;
  ggml_tensor *act_scales;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffe08;
  llm_graph_context *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_fffffffffffffed0;
  ggml_tensor *in_stack_fffffffffffffed8;
  ggml_tensor *in_stack_fffffffffffffee0;
  llm_graph_input_attn_kv_unified *in_stack_fffffffffffffee8;
  ggml_tensor *in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_ffffffffffffff08;
  ggml_tensor *in_stack_ffffffffffffff10;
  ggml_tensor *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  ggml_tensor *local_80;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  ggml_tensor *local_68;
  int local_5c;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd10,
             (llm_graph_params *)in_stack_fffffffffffffd08);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x283d,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_48 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  pgVar2 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffd60);
  llm_graph_context::build_attn_inp_kv_unified((llm_graph_context *)in_stack_fffffffffffffda0);
  for (local_5c = 0; (long)local_5c < *(long *)(in_RDI + 0x28); local_5c = local_5c + 1) {
    local_68 = local_48;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    llm_graph_context::build_norm
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08,(llm_norm_type)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00);
    uVar11 = (undefined4)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    local_70 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->wq_scale != (ggml_tensor *)0x0) {
      in_stack_ffffffffffffff20 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      local_70 = (ggml_tensor *)ggml_mul(in_stack_ffffffffffffff20,local_70,pvVar3->wq_scale);
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->bq != (ggml_tensor *)0x0) {
      in_stack_ffffffffffffff08 = *(ggml_tensor **)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      pgVar4 = (ggml_tensor *)ggml_add(in_stack_ffffffffffffff08,local_70,pvVar3->bq);
      in_stack_ffffffffffffff18 = pgVar4;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                 (char *)in_stack_fffffffffffffd00,il_00);
      in_stack_ffffffffffffff10 = local_70;
      local_70 = pgVar4;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd50);
    pgVar4 = pgVar5;
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    local_78 = pgVar5;
    if (pvVar3->wk_scale != (ggml_tensor *)0x0) {
      in_stack_fffffffffffffee8 = *(llm_graph_input_attn_kv_unified **)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      local_78 = (ggml_tensor *)ggml_mul(in_stack_fffffffffffffee8,pgVar5,pvVar3->wk_scale);
      in_stack_fffffffffffffef0 = pgVar5;
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->bk != (ggml_tensor *)0x0) {
      in_stack_fffffffffffffed0 = *(ggml_tensor **)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      pgVar5 = (ggml_tensor *)ggml_add(in_stack_fffffffffffffed0,local_78,pvVar3->bk);
      in_stack_fffffffffffffee0 = pgVar5;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                 (char *)in_stack_fffffffffffffd00,il_00);
      in_stack_fffffffffffffed8 = local_78;
      local_78 = pgVar5;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    local_80 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50);
    pgVar5 = local_80;
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->wv_scale != (ggml_tensor *)0x0) {
      uVar6 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      in_stack_fffffffffffffec0 = (ggml_tensor *)ggml_mul(uVar6,local_80,pvVar3->wv_scale);
      local_80 = in_stack_fffffffffffffec0;
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->bv != (ggml_tensor *)0x0) {
      uVar6 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      local_80 = (ggml_tensor *)ggml_add(uVar6,local_80,pvVar3->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                 (char *)in_stack_fffffffffffffd00,il_00);
    }
    uVar6 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_70,uVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_78,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_80,uVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    local_308 = *(ggml_type *)(in_RDI + 0xb0);
    ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                  *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                  *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                  *(undefined8 *)(in_RDI + 0xc0),uVar6,pgVar2,0,*(undefined4 *)(in_RDI + 0x30),
                  *(undefined4 *)(in_RDI + 0xb8));
    local_308 = *(ggml_type *)(in_RDI + 0xb0);
    uVar6 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                          *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                          *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                          *(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar2,0,
                          *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    sqrtf((float)uVar1);
    pgVar10 = (ggml_tensor *)CONCAT44(uVar11,local_5c);
    mw = (ggml_tensor *)0x0;
    mb = (ggml_tensor *)0x0;
    _local_308 = uVar6;
    llm_graph_context::build_attn
              ((llm_graph_context *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (ggml_cgraph *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,pgVar5,pgVar4,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               (float)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_ffffffffffffff20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    llm_graph_context::build_norm
              (in_stack_fffffffffffffd20,pgVar10,mw,mb,(llm_norm_type)((ulong)name >> 0x20),
               (int)name);
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    local_40 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->wo_scale != (ggml_tensor *)0x0) {
      uVar6 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      local_40 = (ggml_tensor *)ggml_mul(uVar6,local_40,pvVar3->wo_scale);
    }
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->bo != (ggml_tensor *)0x0) {
      uVar6 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      local_40 = (ggml_tensor *)ggml_add(uVar6,local_40,pvVar3->bo);
    }
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,il_00);
    if ((long)local_5c == *(long *)(in_RDI + 0x28) + -1) {
      pgVar4 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffdf0 = pgVar4;
      local_40 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_40,pgVar4);
      in_stack_fffffffffffffde8 = local_40;
      in_stack_fffffffffffffde0 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar4);
      local_68 = in_stack_fffffffffffffde0;
    }
    pgVar8 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_40,local_68);
    act_scales = pgVar8;
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,il_00);
    down_b = pgVar8;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    cur_00 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd20,pgVar10,mw,mb,(llm_norm_type)((ulong)name >> 0x20)
                        ,(int)name);
    pgVar10 = cur_00;
    llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,il_00);
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    pgVar4 = pvVar3->ffn_up;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    pgVar5 = pvVar3->ffn_gate;
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    in_stack_fffffffffffffd00 = pvVar3->ffn_gate_scale;
    in_stack_fffffffffffffd20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd18 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd10 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd08 = (ggml_tensor *)0x0;
    local_308 = GGML_TYPE_F32;
    il_00 = 0;
    in_stack_fffffffffffffd88 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar4,cur_00,in_stack_fffffffffffffd90,
                    in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                    pgVar5,(ggml_tensor *)&local_308,in_stack_fffffffffffffdc0,down_b,pgVar10,
                    act_scales,(llm_ffn_op_type)in_stack_fffffffffffffde0,
                    (llm_ffn_gate_type)in_stack_fffffffffffffde8,(int)in_stack_fffffffffffffdf0);
    in_stack_fffffffffffffdc0 = in_stack_fffffffffffffd88;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    in_stack_fffffffffffffd90 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                    in_stack_fffffffffffffd08,
                    (llm_norm_type)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                    (int)in_stack_fffffffffffffd00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_5c
              );
    local_40 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd80 = local_40;
    pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_5c);
    if (pvVar3->ffn_down_scale != (ggml_tensor *)0x0) {
      uVar6 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      in_stack_fffffffffffffd78 = (ggml_tensor *)ggml_mul(uVar6,local_40,pvVar3->ffn_down_scale);
      local_40 = in_stack_fffffffffffffd78;
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
    local_48 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_40,pgVar8);
    in_stack_fffffffffffffd60 = local_48;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (char *)in_stack_fffffffffffffd00,il_00);
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                      in_stack_fffffffffffffd08,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                      (int)in_stack_fffffffffffffd00);
  pgVar2 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (char *)in_stack_fffffffffffffd00,il_00);
  plVar9 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x4f2359);
  plVar9->t_embd = pgVar4;
  pgVar2 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffd60,pgVar2,
                      in_stack_fffffffffffffd50);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (char *)in_stack_fffffffffffffd00,il_00);
  plVar9 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x4f23de);
  plVar9->t_logits = pgVar2;
  ggml_build_forward_expand(in_RCX,pgVar2);
  return;
}

Assistant:

llm_build_bitnet(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                if (model.layers[il].wq_scale) {
                    Qcur = ggml_mul(ctx0, Qcur, model.layers[il].wq_scale);
                }
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                // B1.K
                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                if (model.layers[il].wk_scale) {
                    Kcur = ggml_mul(ctx0, Kcur, model.layers[il].wk_scale);
                }
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                // B1.V
                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                if (model.layers[il].wv_scale) {
                    Vcur = ggml_mul(ctx0, Vcur, model.layers[il].wv_scale);
                }
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        NULL, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);

                cur = build_norm(cur,
                        model.layers[il].attn_sub_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "attn_sub_norm", il);

                cur = build_lora_mm(model.layers[il].wo, cur);
                if (model.layers[il].wo_scale) {
                    cur = ggml_mul(ctx0, cur, model.layers[il].wo_scale);
                }
                if (model.layers[il].bo) {
                    cur = ggml_add(ctx0, cur, model.layers[il].bo);
                }
                cb(cur, "attn_o_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward forward
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, model.layers[il].ffn_up_scale,
                    model.layers[il].ffn_gate, NULL, model.layers[il].ffn_gate_scale,
                    NULL,                      NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_sub_out", il);

            cur = build_norm(cur,
                    model.layers[il].ffn_sub_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_sub_norm", il);

            cur = build_lora_mm(model.layers[il].ffn_down, cur);
            if (model.layers[il].ffn_down_scale) {
                cur = ggml_mul(ctx0, cur, model.layers[il].ffn_down_scale);
            }
            cb(cur, "ffn_down", il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        // FIXME: do not use model.tok_embd directly, duplicate as model.output
        cur = build_lora_mm(model.tok_embd, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }